

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_32_4_ffdb6493 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.symbolString = 0;
  gcFrame.errorMessage = 0;
  gcFrame.binding = 0;
  gcFrame.expansionNode = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 4;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  _Var1 = sysbvm_environment_lookSymbolRecursively
                    (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x28),&gcFrame.binding);
  if (_Var1) {
    _Var1 = sysbvm_symbolBinding_isValue(context,gcFrame.binding);
    if (_Var1) {
      sysbvm_stackFrame_popRecord(&local_38);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sVar2 = sysbvm_symbolValueBinding_getValue(gcFrame.binding);
      return sVar2;
    }
    _Var1 = sysbvm_symbolBinding_isMacroValue(context,gcFrame.binding);
    if (_Var1) {
      gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
      sysbvm_stackFrame_popRecord(&local_38);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sVar2 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                        (context,gcFrame.expansionNode,arguments[1]);
      return sVar2;
    }
  }
  gcFrame.symbolString = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(*arguments + 0x28));
  sVar2 = sysbvm_string_createWithCString(context,"Failed to find symbol binding for ");
  gcFrame.errorMessage = sysbvm_string_concat(context,sVar2,gcFrame.symbolString);
  sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;

    struct {
        sysbvm_tuple_t binding;
        sysbvm_tuple_t expansionNode;
        sysbvm_tuple_t symbolString;
        sysbvm_tuple_t errorMessage;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    if(sysbvm_environment_lookSymbolRecursively(context, *environment, (*referenceNode)->value, &gcFrame.binding))
    {
        if(sysbvm_symbolBinding_isValue(context, gcFrame.binding))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_symbolValueBinding_getValue(gcFrame.binding);
        }
        else if(sysbvm_symbolBinding_isMacroValue(context, gcFrame.binding))
        {
            gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionNode, *environment);
        }
    }

    gcFrame.symbolString = sysbvm_tuple_printString(context, (*referenceNode)->value);
    gcFrame.errorMessage = sysbvm_string_concat(context, sysbvm_string_createWithCString(context, "Failed to find symbol binding for "), gcFrame.symbolString);
    sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
    return SYSBVM_NULL_TUPLE;
}